

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Dict.cpp
# Opt level: O1

bool __thiscall ASDCP::Dictionary::DeleteEntry(Dictionary *this,ui32_t index)

{
  _Rb_tree_header *p_Var1;
  MDDEntry *pMVar2;
  _Base_ptr p_Var3;
  _Base_ptr p_Var4;
  iterator __position;
  iterator __position_00;
  bool bVar5;
  MDDEntry NilEntry;
  
  p_Var1 = &(this->m_md_rev_lookup)._M_t._M_impl.super__Rb_tree_header;
  p_Var3 = (this->m_md_rev_lookup)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  p_Var4 = &p_Var1->_M_header;
  for (; p_Var3 != (_Base_ptr)0x0; p_Var3 = (&p_Var3->_M_left)[bVar5]) {
    bVar5 = p_Var3[1]._M_color < index;
    if (!bVar5) {
      p_Var4 = p_Var3;
    }
  }
  __position_00._M_node = &p_Var1->_M_header;
  if (((_Rb_tree_header *)p_Var4 != p_Var1) &&
     (__position_00._M_node = p_Var4, index < p_Var4[1]._M_color)) {
    __position_00._M_node = &p_Var1->_M_header;
  }
  if ((_Rb_tree_header *)__position_00._M_node != p_Var1) {
    __position = std::
                 _Rb_tree<ASDCP::UL,_std::pair<const_ASDCP::UL,_unsigned_int>,_std::_Select1st<std::pair<const_ASDCP::UL,_unsigned_int>_>,_std::less<ASDCP::UL>,_std::allocator<std::pair<const_ASDCP::UL,_unsigned_int>_>_>
                 ::find((_Rb_tree<ASDCP::UL,_std::pair<const_ASDCP::UL,_unsigned_int>,_std::_Select1st<std::pair<const_ASDCP::UL,_unsigned_int>_>,_std::less<ASDCP::UL>,_std::allocator<std::pair<const_ASDCP::UL,_unsigned_int>_>_>
                         *)this,(key_type *)&__position_00._M_node[1]._M_parent);
    if ((_Rb_tree_header *)__position._M_node ==
        &(this->m_md_lookup)._M_t._M_impl.super__Rb_tree_header) {
      __assert_fail("ii != m_md_lookup.end()",
                    "/workspace/llm4binary/github/license_c_cmakelists/cinecert[P]asdcplib/src/Dict.cpp"
                    ,0x104,"bool ASDCP::Dictionary::DeleteEntry(ui32_t)");
    }
    std::
    _Rb_tree<ASDCP::UL,std::pair<ASDCP::UL_const,unsigned_int>,std::_Select1st<std::pair<ASDCP::UL_const,unsigned_int>>,std::less<ASDCP::UL>,std::allocator<std::pair<ASDCP::UL_const,unsigned_int>>>
    ::erase_abi_cxx11_((_Rb_tree<ASDCP::UL,std::pair<ASDCP::UL_const,unsigned_int>,std::_Select1st<std::pair<ASDCP::UL_const,unsigned_int>>,std::less<ASDCP::UL>,std::allocator<std::pair<ASDCP::UL_const,unsigned_int>>>
                        *)this,__position);
    std::
    _Rb_tree<unsigned_int,std::pair<unsigned_int_const,ASDCP::UL>,std::_Select1st<std::pair<unsigned_int_const,ASDCP::UL>>,std::less<unsigned_int>,std::allocator<std::pair<unsigned_int_const,ASDCP::UL>>>
    ::erase_abi_cxx11_((_Rb_tree<unsigned_int,std::pair<unsigned_int_const,ASDCP::UL>,std::_Select1st<std::pair<unsigned_int_const,ASDCP::UL>>,std::less<unsigned_int>,std::allocator<std::pair<unsigned_int_const,ASDCP::UL>>>
                        *)&this->m_md_rev_lookup,__position_00);
    pMVar2 = this->m_MDD_Table + index;
    pMVar2->ul[0] = '\0';
    pMVar2->ul[1] = '\0';
    pMVar2->ul[2] = '\0';
    pMVar2->ul[3] = '\0';
    pMVar2->ul[4] = '\0';
    pMVar2->ul[5] = '\0';
    pMVar2->ul[6] = '\0';
    pMVar2->ul[7] = '\0';
    pMVar2->ul[8] = '\0';
    pMVar2->ul[9] = '\0';
    pMVar2->ul[10] = '\0';
    pMVar2->ul[0xb] = '\0';
    pMVar2->ul[0xc] = '\0';
    pMVar2->ul[0xd] = '\0';
    pMVar2->ul[0xe] = '\0';
    pMVar2->ul[0xf] = '\0';
    pMVar2 = this->m_MDD_Table + index;
    (pMVar2->tag).a = '\0';
    (pMVar2->tag).b = '\0';
    pMVar2->optional = false;
    *(undefined5 *)&pMVar2->field_0x13 = 0;
    *(char **)(&pMVar2->tag + 4) = (char *)0x0;
  }
  return (_Rb_tree_header *)__position_00._M_node != p_Var1;
}

Assistant:

bool
ASDCP::Dictionary::DeleteEntry(ui32_t index)
{
  std::map<ui32_t, ASDCP::UL>::iterator rii = m_md_rev_lookup.find(index);
  if ( rii != m_md_rev_lookup.end() )
    {
      std::map<ASDCP::UL, ui32_t>::iterator ii = m_md_lookup.find(rii->second);
      assert(ii != m_md_lookup.end());

      MDDEntry NilEntry;
      memset(&NilEntry, 0, sizeof(NilEntry));

      m_md_lookup.erase(ii);
      m_md_rev_lookup.erase(rii);
      m_MDD_Table[index] = NilEntry;
      return true;
    }

  return false;
}